

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void icu_63::makeTargetName
               (char *itemName,char *id,int32_t idLength,char *suffix,char *target,int32_t capacity,
               UErrorCode *pErrorCode)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int32_t targetLength;
  int32_t suffixLength;
  int32_t treeLength;
  char *itemID;
  int32_t capacity_local;
  char *target_local;
  char *suffix_local;
  int32_t idLength_local;
  char *id_local;
  char *itemName_local;
  
  pcVar3 = strrchr(itemName,0x2f);
  _suffixLength = itemName;
  if (pcVar3 != (char *)0x0) {
    _suffixLength = pcVar3 + 1;
  }
  iVar1 = (int)_suffixLength - (int)itemName;
  suffix_local._4_4_ = idLength;
  if (idLength < 0) {
    sVar4 = strlen(id);
    suffix_local._4_4_ = (int32_t)sVar4;
  }
  sVar4 = strlen(suffix);
  iVar2 = iVar1 + suffix_local._4_4_ + (int)sVar4;
  if (iVar2 < capacity) {
    memcpy(target,itemName,(long)iVar1);
    memcpy(target + iVar1,id,(long)suffix_local._4_4_);
    memcpy(target + (long)suffix_local._4_4_ + (long)iVar1,suffix,(long)((int)sVar4 + 1));
  }
  else {
    fprintf(_stderr,"icupkg/makeTargetName(%s) target item name length %ld too long\n",itemName,
            (long)iVar2);
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

static void 
makeTargetName(const char *itemName, const char *id, int32_t idLength, const char *suffix,
               char *target, int32_t capacity,
               UErrorCode *pErrorCode) {
    const char *itemID;
    int32_t treeLength, suffixLength, targetLength;

    // get the item basename
    itemID=strrchr(itemName, '/');
    if(itemID!=NULL) {
        ++itemID;
    } else {
        itemID=itemName;
    }

    // build the target string
    treeLength=(int32_t)(itemID-itemName);
    if(idLength<0) {
        idLength=(int32_t)strlen(id);
    }
    suffixLength=(int32_t)strlen(suffix);
    targetLength=treeLength+idLength+suffixLength;
    if(targetLength>=capacity) {
        fprintf(stderr, "icupkg/makeTargetName(%s) target item name length %ld too long\n",
                        itemName, (long)targetLength);
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return;
    }

    memcpy(target, itemName, treeLength);
    memcpy(target+treeLength, id, idLength);
    memcpy(target+treeLength+idLength, suffix, suffixLength+1); // +1 includes the terminating NUL
}